

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makePatchChange(MidiMessage *this,int channel,int patchnum)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte local_1a;
  byte local_19;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_19 = (byte)channel & 0xf | 0xc0;
  iVar2._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_19);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = local_19;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_1a = (byte)patchnum & 0x7f;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_1a);
  }
  else {
    *iVar2._M_current = local_1a;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

void MidiMessage::makePatchChange(int channel, int patchnum) {
	resize(0);
	push_back(0xc0 | (0x0f & channel));
	push_back(0x7f & patchnum);
}